

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall
edition_unittest::TestChildExtensionData::InternalSwap
          (TestChildExtensionData *this,TestChildExtensionData *other)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  TestChildExtensionData_NestedTestAllExtensionsData *pTVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  long __tmp;
  
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar8 = uVar2;
  if ((uVar2 & 1) != 0) {
    uVar8 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  uVar3 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar9 = uVar3;
  if ((uVar3 & 1) != 0) {
    uVar9 = *(ulong *)(uVar3 & 0xfffffffffffffffe);
  }
  if (uVar8 == uVar9) {
    (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = uVar3;
    (other->super_Message).super_MessageLite._internal_metadata_.ptr_ = uVar2;
    uVar1 = (this->field_0)._impl_._has_bits_.has_bits_[0];
    (this->field_0)._impl_._has_bits_.has_bits_[0] = (other->field_0)._impl_._has_bits_.has_bits_[0]
    ;
    (other->field_0)._impl_._has_bits_.has_bits_[0] = uVar1;
    pvVar5 = (other->field_0)._impl_.a_.tagged_ptr_.ptr_;
    pvVar6 = (other->field_0)._impl_.b_.tagged_ptr_.ptr_;
    pvVar7 = (this->field_0)._impl_.b_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.a_.tagged_ptr_.ptr_ = (this->field_0)._impl_.a_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.b_.tagged_ptr_.ptr_ = pvVar7;
    (this->field_0)._impl_.a_.tagged_ptr_.ptr_ = pvVar5;
    (this->field_0)._impl_.b_.tagged_ptr_.ptr_ = pvVar6;
    pTVar4 = (this->field_0)._impl_.optional_extension_;
    (this->field_0)._impl_.optional_extension_ = (other->field_0)._impl_.optional_extension_;
    (other->field_0)._impl_.optional_extension_ = pTVar4;
    return;
  }
  InternalSwap();
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }